

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O0

node * NodeSingleton(anynode *Any,fourcc_t Class)

{
  long local_38;
  bool_t Found;
  size_t Pos;
  nodecontext *p;
  node *Node;
  anynode *paStack_10;
  fourcc_t Class_local;
  anynode *Any_local;
  
  p = (nodecontext *)0x0;
  if (Any != (anynode *)0x0) {
    Node._4_4_ = Class;
    paStack_10 = Any;
    if (Any == (anynode *)0x0) {
      __assert_fail("(const void*)(Any)!=NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                    ,0x5d2,"node *NodeSingleton(anynode *, fourcc_t)");
    }
    Pos = **(size_t **)((long)Any + 8);
    if (Pos == 0xffffffffffffffa0) {
      __assert_fail("&(*&p->NodeSingleton)!=NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                    ,0x5d6,"node *NodeSingleton(anynode *, fourcc_t)");
    }
    Found = ArrayFindEx((array *)(Pos + 0x60),*(ulong *)(Pos + 0x68) >> 3,8,
                        (void *)((long)&Node + 4),CmpNodeClass,(void *)0x0,&local_38);
    if (local_38 != 0) {
      if (Pos == 0xffffffffffffffa0) {
        __assert_fail("&(p->NodeSingleton)!=NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                      ,0x5d8,"node *NodeSingleton(anynode *, fourcc_t)");
      }
      p = *(nodecontext **)(*(long *)(Pos + 0x60) + Found * 8);
    }
  }
  return (node *)p;
}

Assistant:

node* NodeSingleton(anynode* Any, fourcc_t Class)
{
    node* Node = NULL;
    if (Any)
    {
        nodecontext* p = Node_Context(Any);
        size_t Pos;
        bool_t Found;

        Pos = ArrayFind(&p->NodeSingleton,node*,&Class,CmpNodeClass,NULL,&Found);
        if (Found)
            Node = ARRAYBEGIN(p->NodeSingleton,node*)[Pos];
    }
    return Node;
}